

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

void Cmd_RunAutoTuner(char *pConfig,char *pFileList,int nCores)

{
  satoko_opts_t *pOpts;
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  Vec_Wec_t *vPars;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  timespec ts;
  timespec local_70;
  Vec_Ptr_t *local_60;
  int local_54;
  long local_50;
  Vec_Wec_t *local_48;
  void *local_40;
  Vec_Ptr_t *local_38;
  
  local_54 = nCores;
  iVar2 = clock_gettime(3,&local_70);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  vPars = Cmd_ReadParamChoices(pConfig);
  __ptr = Cmd_ReadFiles(pFileList);
  if (vPars == (Vec_Wec_t *)0x0) {
    __ptr_00 = (Vec_Ptr_t *)0x0;
  }
  else {
    __ptr_00 = Cmf_CreateOptions(vPars);
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0 && __ptr != (Vec_Ptr_t *)0x0) {
    local_60 = __ptr;
    local_50 = lVar4;
    local_48 = vPars;
    if (__ptr_00->nSize < 2) {
      uVar8 = 0x7fffffff;
      pvVar5 = (void *)0x0;
    }
    else {
      lVar4 = 1;
      pvVar5 = (void *)0x0;
      uVar7 = 0x7fffffff;
      local_38 = __ptr_00;
      do {
        pOpts = (satoko_opts_t *)local_38->pArray[lVar4 + -1];
        local_40 = local_38->pArray[lVar4];
        iVar2 = clock_gettime(3,&local_70);
        lVar6 = 1;
        if (-1 < iVar2) {
          lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
          lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_70.tv_sec * -1000000;
        }
        printf("Evaluating settings: %20s...  \n",local_40);
        uVar3 = Cmd_RunAutoTunerEval(local_60,pOpts,local_54);
        printf("Cost = %6d.  ",(ulong)uVar3);
        iVar2 = clock_gettime(3,&local_70);
        if (iVar2 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        Abc_Print(1,"%s =","Time");
        Abc_Print(1,"%9.2f sec\n",(double)(lVar9 + lVar6) / 1000000.0);
        uVar8 = uVar7;
        if ((int)uVar3 <= (int)uVar7) {
          uVar8 = uVar3;
        }
        if ((int)uVar3 < (int)uVar7) {
          pvVar5 = local_40;
        }
        lVar4 = lVar4 + 2;
        __ptr_00 = local_38;
        uVar7 = uVar8;
      } while ((int)lVar4 < local_38->nSize);
    }
    printf("The best settings are: %20s    \n",pvVar5);
    printf("Best cost = %6d.  ",(ulong)uVar8);
    iVar2 = clock_gettime(3,&local_70);
    vPars = local_48;
    __ptr = local_60;
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    lVar4 = lVar4 + local_50;
    Abc_Print(1,"%s =","Total time");
    Abc_Print(1,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  }
  if (vPars != (Vec_Wec_t *)0x0) {
    if (0 < vPars->nCap) {
      lVar4 = 8;
      lVar6 = 0;
      do {
        pvVar5 = *(void **)((long)&vPars->pArray->nCap + lVar4);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
          *(undefined8 *)((long)&vPars->pArray->nCap + lVar4) = 0;
        }
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar6 < vPars->nCap);
    }
    if (vPars->pArray != (Vec_Int_t *)0x0) {
      free(vPars->pArray);
      vPars->pArray = (Vec_Int_t *)0x0;
    }
    vPars->nCap = 0;
    vPars->nSize = 0;
    free(vPars);
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr_00->nSize) {
      lVar4 = 0;
      do {
        if ((void *)0x2 < __ptr_00->pArray[lVar4]) {
          free(__ptr_00->pArray[lVar4]);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < __ptr_00->nSize);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    free(__ptr_00);
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar2 = __ptr->nSize;
    if (0 < (long)iVar2) {
      ppvVar1 = __ptr->pArray;
      lVar4 = 0;
      do {
        Gia_ManStop((Gia_Man_t *)ppvVar1[lVar4]);
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  return;
}

Assistant:

void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vPars = Cmd_ReadParamChoices( pConfig );
    Vec_Ptr_t * vAigs = Cmd_ReadFiles( pFileList );
    Vec_Ptr_t * vOpts = vPars ? Cmf_CreateOptions( vPars ) : NULL;
    int i; char * pString, * pStringBest = NULL;
    satoko_opts_t * pOpts, * pOptsBest = NULL;
    int Result, ResultBest = 0x7FFFFFFF;
    Gia_Man_t * pGia; 
    // iterate through all possible option settings
    if ( vAigs && vOpts )
    {
        Vec_PtrForEachEntryDouble( satoko_opts_t *, char *, vOpts, pOpts, pString, i )
        {
            abctime clk = Abc_Clock();
            printf( "Evaluating settings: %20s...  \n", pString );
            Result = Cmd_RunAutoTunerEval( vAigs, pOpts, nCores );
            printf( "Cost = %6d.  ", Result );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( ResultBest > Result )
            {
                ResultBest = Result;
                pStringBest = pString;
                pOptsBest = pOpts;
            }
        }
        printf( "The best settings are: %20s    \n", pStringBest );
        printf( "Best cost = %6d.  ", ResultBest );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    // cleanup
    if ( vPars ) Vec_WecFree( vPars );
    if ( vOpts ) Vec_PtrFreeFree( vOpts );
    if ( vAigs )
    {
        Vec_PtrForEachEntry( Gia_Man_t *, vAigs, pGia, i )
            Gia_ManStop( pGia );
        Vec_PtrFree( vAigs );
    }
}